

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_target(t_parser *this,bool a_assignable)

{
  t_at *ptVar1;
  long lVar2;
  undefined8 uVar3;
  t_lexer *this_00;
  byte bVar4;
  char cVar5;
  t_token tVar6;
  size_t sVar7;
  t_object *ptVar8;
  t_variable *__args_3;
  t_scope *ptVar9;
  iterator iVar10;
  _Rb_tree_node_base *p_Var11;
  t_scope *ptVar12;
  pointer puVar13;
  wchar_t in_EDX;
  wchar_t *pwVar14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  pointer *__ptr;
  ulong uVar17;
  undefined7 in_register_00000031;
  t_parser *this_01;
  t_parser *this_02;
  _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
  *this_03;
  long lVar18;
  t_at *__args;
  size_t sVar19;
  long in_FS_OFFSET;
  bool bVar20;
  pair<std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_bool>
  pVar21;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  wstring_view a_message_02;
  wstring_view a_message_03;
  wstring_view a_message_04;
  wstring_view a_message_05;
  t_lexer *ptStack_c0;
  size_t outer;
  t_scope *scope;
  t_object *symbol;
  undefined1 auStack_a0 [16];
  undefined1 local_90 [16];
  t_lexer *local_80;
  t_at at;
  t_object *key;
  undefined1 local_50 [32];
  
  this_01 = (t_parser *)CONCAT71(in_register_00000031,a_assignable);
  __args = (t_at *)&outer;
  at.v_column = (this_01->v_lexer).v_at.v_column;
  at.v_position = (this_01->v_lexer).v_at.v_position;
  at.v_line = (this_01->v_lexer).v_at.v_line;
  tVar6 = (this_01->v_lexer).v_token;
  if (0x2c < tVar6 - c_token__APOSTROPHE) {
switchD_00175b31_caseD_6:
    pwVar14 = L"unexpected token.";
    ptStack_c0 = (t_lexer *)0x11;
    goto LAB_00176a02;
  }
  this_02 = (t_parser *)&this_01->v_lexer;
  ptVar1 = &(this_01->v_lexer).v_at;
  switch(tVar6) {
  case c_token__APOSTROPHE:
    t_lexer::f_next((t_lexer *)this_02);
    tVar6 = (this_01->v_lexer).v_token;
    if (tVar6 == c_token__LEFT_PARENTHESIS) {
      pwVar14 = (this_01->v_lexer).v_indent.v_i;
      ptVar8 = (this_01->v_lexer).v_indent.v_p;
      t_lexer::f_next((t_lexer *)this_02);
      scope = (t_scope *)
              t_script::f_slot(this_01->v_module,
                               (t_object *)
                               (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1a8) + -0x48));
      std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
                ((t_at *)&outer,(t_object **)&at);
      std::
      make_unique<xemmai::ast::t_call,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>>>
                ((t_at *)&symbol,
                 (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                  *)&at);
      if (outer != 0) {
        (**(code **)(*(long *)outer + 8))();
      }
      uVar17 = (long)pwVar14 + (-0x50 - (long)ptVar8);
      bVar4 = (this_01->v_lexer).v_newline;
      if ((((bool)bVar4 != true) ||
          (uVar17 < (ulong)((long)(this_01->v_lexer).v_indent.v_i +
                           (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)))) &&
         ((this_01->v_lexer).v_token != c_token__RIGHT_PARENTHESIS)) {
        bVar20 = f_expressions(this_01,(long)uVar17 >> 2,
                               (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                                *)&symbol->v_cyclic);
        *(bool *)&symbol->v_type = bVar20;
        bVar4 = (this_01->v_lexer).v_newline;
      }
      local_90._0_8_ = symbol;
      if ((((bVar4 & 1) == 0) ||
          (uVar17 <= (ulong)((long)(this_01->v_lexer).v_indent.v_i +
                            (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)))) &&
         ((this_01->v_lexer).v_token == c_token__RIGHT_PARENTHESIS)) {
        t_lexer::f_next((t_lexer *)this_02);
        local_90._0_8_ = symbol;
      }
      goto LAB_001769e1;
    }
    if (tVar6 == c_token__SYMBOL) {
      symbol = f_symbol(this_01);
      t_lexer::f_next((t_lexer *)this_02);
      std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*&>
                ((t_at *)&outer,(t_object **)&at);
      goto LAB_00176176;
    }
    pwVar14 = L"expecting symbol or \'(\'.";
    goto LAB_00176aa3;
  case c_token__LEFT_PARENTHESIS:
    t_lexer::f_next((t_lexer *)this_02);
    f_expression(this);
    if ((this_01->v_lexer).v_token == c_token__RIGHT_PARENTHESIS) {
      t_lexer::f_next((t_lexer *)this_02);
      return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
    }
    a_message_03._M_str = L"expecting \')\'.";
    a_message_03._M_len = 0xe;
    f_throw(this_01,a_message_03);
  default:
    goto switchD_00175b31_caseD_6;
  case c_token__COLON:
  case c_token__SYMBOL:
  case c_token__SELF:
    outer = 0;
    ptVar12 = this_01->v_scope;
    if (tVar6 == c_token__COLON) {
      sVar19 = (this_01->v_lexer).field_11.v_integer;
      sVar7 = sVar19;
      while (bVar20 = sVar7 != 0, sVar7 = sVar7 - 1, outer = sVar19, scope = ptVar12, bVar20) {
        local_90._8_8_ = this;
        if (ptVar12 == (t_scope *)0x0) goto LAB_001769f9;
        ptVar12 = ptVar12->v_outer;
      }
      local_90._8_8_ = this;
      t_lexer::f_next((t_lexer *)this_02);
      tVar6 = (this_01->v_lexer).v_token;
    }
    else {
      sVar19 = 0;
      scope = ptVar12;
      local_90._8_8_ = this;
    }
    if (tVar6 == c_token__SELF) {
      if (ptVar12 != (t_scope *)0x0) {
        if (sVar19 != 0) {
          ptVar12->v_self_shared = true;
        }
        local_80 = (t_lexer *)this_02;
        local_50._20_4_ = in_EDX;
        local_50._24_8_ = ptVar1;
        local_90._0_8_ = operator_new(0x28);
        (((t_scope *)local_90._0_8_)->v_block).
        super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)at.v_position;
        (((t_scope *)local_90._0_8_)->v_block).
        super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)at.v_line;
        (((t_scope *)local_90._0_8_)->v_block).
        super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)at.v_column;
        ((t_scope *)local_90._0_8_)->v_outer = (t_scope *)&PTR__t_node_001ad0d8;
        ((t_scope *)local_90._0_8_)->v_shared = (bool)(char)sVar19;
        ((t_scope *)local_90._0_8_)->v_self_shared = (bool)(char)(sVar19 >> 8);
        *(int6 *)&((t_scope *)local_90._0_8_)->field_0x22 = (int6)(sVar19 >> 0x10);
        pwVar14 = (this_01->v_lexer).v_value.v_i;
        ptVar12 = (t_scope *)local_90._0_8_;
        for (pcVar16 = ((this_01->v_lexer).v_value.v_p)->v_data + 8; this_00 = local_80,
            (wchar_t *)pcVar16 != pwVar14; pcVar16 = pcVar16 + 4) {
          if (*(int *)pcVar16 == 0x40) {
            ptVar9 = (t_scope *)operator_new(0x28);
            (ptVar9->v_block).
            super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)at.v_column;
            (ptVar9->v_block).
            super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)at.v_position;
            (ptVar9->v_block).
            super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)at.v_line;
            ptVar9->v_outer = (t_scope *)&PTR__t_class_001ad120;
          }
          else {
            ptVar9 = (t_scope *)operator_new(0x28);
            (ptVar9->v_block).
            super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)at.v_column;
            (ptVar9->v_block).
            super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)at.v_position;
            (ptVar9->v_block).
            super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)at.v_line;
            ptVar9->v_outer = (t_scope *)&PTR__t_super_001ad168;
          }
          *(t_scope **)&ptVar9->v_shared = ptVar12;
          ptVar12 = ptVar9;
        }
        local_90._0_8_ = ptVar12;
        t_lexer::f_next(local_80);
        this = (t_parser *)local_90._8_8_;
        if (((this_01->v_lexer).v_newline != false) ||
           ((this_01->v_lexer).v_token != c_token__SYMBOL)) {
          *(t_scope **)local_90._8_8_ = ptVar12;
          return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
                 local_90._8_8_;
        }
        auStack_a0._8_8_ = *(size_t *)(local_50._24_8_ + 0x10);
        symbol = *(t_object **)local_50._24_8_;
        auStack_a0._0_8_ = *(size_t *)(local_50._24_8_ + 8);
        key = f_symbol(this_01);
        t_lexer::f_next(this_00);
        if ((this_01->v_lexer).v_token == c_token__EQUAL) {
          if (local_50[0x14] == '\0') {
            a_message_04._M_str = L"can not assign to expression.";
            a_message_04._M_len = 0x1d;
            f_throw(this_01,a_message_04);
          }
          t_lexer::f_next(this_00);
          f_expression((t_parser *)(local_50 + 8));
          std::
          make_unique<xemmai::ast::t_object_put,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,xemmai::t_object*&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                    ((t_at *)local_50,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &symbol,(t_object **)local_90,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &key);
          uVar3 = local_50._0_8_;
          local_50._0_8_ = (pointer)0x0;
          this->v_module = uVar3;
          ptVar12 = (t_scope *)local_90._0_8_;
          if ((t_object *)local_50._8_8_ != (t_object *)0x0) {
            (*(code *)(*(t_object **)local_50._8_8_)->v_previous)();
            ptVar12 = (t_scope *)local_90._0_8_;
          }
        }
        else {
          std::
          make_unique<xemmai::ast::t_object_get,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,xemmai::t_object*&>
                    ((t_at *)local_50,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &symbol,(t_object **)local_90);
          this->v_module = local_50._0_8_;
          ptVar12 = (t_scope *)local_90._0_8_;
        }
        goto LAB_0017699d;
      }
    }
    else {
      if (tVar6 != c_token__SYMBOL) {
        pwVar14 = L"expecting symbol or self.";
        ptStack_c0 = (t_lexer *)0x19;
        goto LAB_00176a02;
      }
      ptVar8 = f_symbol(this_01);
      symbol = ptVar8;
      t_lexer::f_next((t_lexer *)this_02);
      if ((this_01->v_lexer).v_token != c_token__EQUAL) {
        if (ptVar12 != (t_scope *)0x0) {
          this_03 = (_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                     *)&ptVar12->v_references;
          if (sVar19 != 0) {
            this_03 = (_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                       *)&ptVar12->v_unresolveds;
          }
          std::
          _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
          ::_M_insert_unique<xemmai::t_object*const&>(this_03,&symbol);
        }
        std::
        make_unique<xemmai::ast::t_symbol_get,xemmai::t_at&,unsigned_long&,xemmai::ast::t_scope*&,xemmai::t_object*&>
                  ((t_at *)local_90,(unsigned_long *)&at,(t_scope **)&outer,(t_object **)&scope);
        this = (t_parser *)local_90._8_8_;
        goto LAB_001769e1;
      }
      if ((char)in_EDX == '\0') {
        pwVar14 = L"can not assign to expression.";
        ptStack_c0 = (t_lexer *)0x1d;
        goto LAB_00176a02;
      }
      if (ptVar12 != (t_scope *)0x0) {
        t_lexer::f_next((t_lexer *)this_02);
        __args_3 = f_variable(this_02,ptVar12,ptVar8);
        if (sVar19 != 0) {
          __args_3->v_shared = true;
          __args_3->v_varies = true;
        }
        f_expression((t_parser *)&key);
        std::
        make_unique<xemmai::ast::t_scope_put,xemmai::t_at&,unsigned_long&,xemmai::t_code::t_variable&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                  ((t_at *)local_90,(unsigned_long *)&at,(t_variable *)&outer,
                   (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                   __args_3);
        uVar3 = local_90._0_8_;
        local_90._0_8_ = (t_scope *)0x0;
        *(undefined8 *)local_90._8_8_ = uVar3;
        ptVar12 = (t_scope *)key;
        this = (t_parser *)local_90._8_8_;
        goto LAB_0017699d;
      }
    }
LAB_001769f9:
    pwVar14 = L"no more outer scope.";
    ptStack_c0 = (t_lexer *)0x14;
    goto LAB_00176a02;
  case c_token__ATMARK:
    pwVar14 = (this_01->v_lexer).v_indent.v_i;
    ptVar8 = (this_01->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_02);
    std::make_unique<xemmai::ast::t_lambda,xemmai::t_at&,xemmai::ast::t_scope*&>
              ((t_at *)&outer,(t_scope **)&at);
    bVar4 = (this_01->v_lexer).v_newline;
    if (((bool)bVar4 == false) && ((this_01->v_lexer).v_token == c_token__LEFT_PARENTHESIS)) {
      t_lexer::f_next((t_lexer *)this_02);
      tVar6 = (this_01->v_lexer).v_token;
      if (tVar6 != c_token__RIGHT_PARENTHESIS) {
        local_90._8_8_ = L"expecting symbol or \'*\'.";
        local_80 = (t_lexer *)0x18;
LAB_0017629a:
        do {
          sVar19 = outer;
          if (tVar6 != c_token__SYMBOL) {
            if (tVar6 != c_token__ASTERISK) goto LAB_00176a48;
            t_lexer::f_next((t_lexer *)this_02);
            sVar19 = outer;
            if ((this_01->v_lexer).v_token == c_token__SYMBOL) {
              local_90._0_8_ = f_symbol(this_01);
              symbol = (t_object *)0x0;
              auStack_a0._0_8_ = (long *)0x0;
              pVar21 = std::
                       _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                       ::_M_emplace_unique<xemmai::t_object*,xemmai::t_code::t_variable>
                                 ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                                   *)(sVar19 + 0xa8),(t_object **)local_90,(t_variable *)&symbol);
              scope = (t_scope *)&pVar21.first._M_node._M_node[1]._M_parent;
              std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
              emplace_back<xemmai::t_code::t_variable*>
                        ((vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                          *)(sVar19 + 0xd8),(t_variable **)&scope);
              *(undefined1 *)(outer + 0x1a8) = 1;
              t_lexer::f_next((t_lexer *)this_02);
              tVar6 = (this_01->v_lexer).v_token;
              goto LAB_001766b7;
            }
            local_90._8_8_ = L"expecting symbol.";
            ptStack_c0 = (t_lexer *)0x11;
LAB_00176aec:
            local_80 = ptStack_c0;
LAB_00176a48:
            a_message_02._M_str = (wchar_t *)local_90._8_8_;
            a_message_02._M_len = (size_t)local_80;
            f_throw(this_01,a_message_02);
          }
          local_90._0_8_ = f_symbol(this_01);
          symbol = (t_object *)0x0;
          auStack_a0._0_8_ = (long *)0x0;
          pVar21 = std::
                   _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                   ::_M_emplace_unique<xemmai::t_object*,xemmai::t_code::t_variable>
                             ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                               *)(sVar19 + 0xa8),(t_object **)local_90,(t_variable *)&symbol);
          scope = (t_scope *)&pVar21.first._M_node._M_node[1]._M_parent;
          std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
          emplace_back<xemmai::t_code::t_variable*>
                    ((vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                      *)(sVar19 + 0xd8),(t_variable **)&scope);
          t_lexer::f_next((t_lexer *)this_02);
          if ((this_01->v_lexer).v_token == c_token__EQUAL) {
            t_lexer::f_next((t_lexer *)this_02);
            sVar19 = outer;
            f_expression((t_parser *)&symbol);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
            ::
            emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                      ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                        *)(sVar19 + 0x1b8),
                       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                       )&symbol);
            if (symbol != (t_object *)0x0) {
              (*(code *)symbol->v_next->v_previous)();
            }
          }
          else if (*(long *)(outer + 0x1c0) != *(long *)(outer + 0x1b8)) {
            local_80 = (t_lexer *)0xe;
            local_90._8_8_ = L"expecting \'=\'.";
            goto LAB_00176a48;
          }
          tVar6 = (this_01->v_lexer).v_token;
          if ((this_01->v_lexer).v_newline != true) {
            if (tVar6 != c_token__COMMA) {
LAB_001766b7:
              if (tVar6 != c_token__RIGHT_PARENTHESIS) {
                local_90._8_8_ = L"expecting \')\'.";
                ptStack_c0 = (t_lexer *)0xe;
                goto LAB_00176aec;
              }
              break;
            }
            t_lexer::f_next((t_lexer *)this_02);
            tVar6 = (this_01->v_lexer).v_token;
            goto LAB_0017629a;
          }
        } while (tVar6 != c_token__RIGHT_PARENTHESIS);
      }
      t_lexer::f_next((t_lexer *)this_02);
      bVar4 = (this_01->v_lexer).v_newline;
    }
    sVar19 = outer;
    uVar17 = (long)pwVar14 + (-0x50 - (long)ptVar8);
    *(undefined8 *)(outer + 0x1b0) = *(undefined8 *)(outer + 0xd0);
    this_01->v_scope->v_shared = true;
    ptVar12 = (t_scope *)(outer + 0x20);
    if (outer == 0) {
      ptVar12 = (t_scope *)0x0;
    }
    this_01->v_scope = ptVar12;
    bVar20 = this_01->v_can_return;
    this_01->v_can_return = true;
    local_80 = (t_lexer *)CONCAT71(local_80._1_7_,this_01->v_can_jump);
    if ((bVar4 & 1) == 0) {
      local_90._8_8_ = this;
      f_expression((t_parser *)&symbol);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
      ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                  *)(sVar19 + 0x28),
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 &symbol);
      if (symbol != (t_object *)0x0) {
        (*(code *)symbol->v_next->v_previous)();
      }
      if (((this_01->v_lexer).v_newline == true) &&
         (uVar17 < (ulong)((long)(this_01->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)))) {
        a_message_05._M_str = L"unexpected indent.";
        a_message_05._M_len = 0x12;
        f_throw(this_01,a_message_05);
      }
    }
    else {
      local_90._8_8_ = this;
      if (uVar17 < (ulong)((long)(this_01->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_01->v_lexer).v_indent.v_p))) {
        f_block(this_01,(vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                         *)(outer + 0x28));
      }
    }
    p_Var15 = (_Rb_tree_node_base *)(outer + 0x80);
    for (p_Var11 = *(_Rb_tree_node_base **)(outer + 0x90); p_Var11 != p_Var15;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      symbol = *(t_object **)(p_Var11 + 1);
      iVar10 = std::
               _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
               ::find((_Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
                       *)(outer + 0xa8),&symbol);
      if (iVar10._M_node == (_Base_ptr)(outer + 0xb0)) {
        std::
        _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
        ::_M_insert_unique<xemmai::t_object*const&>
                  ((_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                    *)(*(long *)(outer + 0x20) + 0x58),&symbol);
      }
      else {
        *(undefined1 *)&iVar10._M_node[1]._M_parent = 1;
      }
    }
    p_Var15 = (_Rb_tree_node_base *)(outer + 0x50);
    for (p_Var11 = *(_Rb_tree_node_base **)(outer + 0x60); p_Var11 != p_Var15;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      symbol = *(t_object **)(p_Var11 + 1);
      iVar10 = std::
               _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
               ::find((_Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
                       *)(outer + 0xa8),&symbol);
      if (iVar10._M_node == (_Base_ptr)(outer + 0xb0)) {
        std::
        _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
        ::_M_insert_unique<xemmai::t_object*const&>
                  ((_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                    *)(*(long *)(outer + 0x20) + 0x58),&symbol);
      }
    }
    this_01->v_scope = *(t_scope **)(outer + 0x20);
    this_01->v_can_jump = local_80._0_1_;
    this_01->v_can_return = bVar20;
    ptVar8 = *(t_object **)(outer + 0xd8);
    auStack_a0._0_8_ = *(undefined8 *)(outer + 0xe0);
    auStack_a0._8_8_ = *(size_t *)(outer + 0xe8);
    *(undefined8 *)(outer + 0xe8) = 0;
    *(undefined8 *)(outer + 0xd8) = 0;
    *(undefined8 *)(outer + 0xe0) = 0;
    if (*(char *)(outer + 0x41) != '\0') {
      *(long *)(outer + 0xf0) = *(long *)(outer + 0xf0) + 1;
    }
    lVar2 = *(long *)(outer + 0x1b0);
    pcVar16 = ptVar8->v_data + lVar2 * 8 + -0x48;
    symbol = ptVar8;
    for (lVar18 = 0; this = (t_parser *)local_90._8_8_, lVar2 << 3 != lVar18; lVar18 = lVar18 + 8) {
      scope = *(t_scope **)(ptVar8->v_data + lVar18 + -0x48);
      if (*(char *)&scope->v_outer == '\x01') {
        puVar13 = *(pointer *)(outer + 0xf0);
        *(undefined1 **)(outer + 0xf0) =
             (undefined1 *)
             ((long)&(puVar13->_M_t).
                     super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                     ._M_t + 1);
      }
      else {
        puVar13 = (pointer)(*(long *)(outer + 0xe0) - *(long *)(outer + 0xd8) >> 3);
      }
      (scope->v_block).
      super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar13;
      std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
      push_back((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                 *)(outer + 0xd8),(value_type *)&scope);
    }
    for (; sVar19 = outer, pcVar16 != (char *)auStack_a0._0_8_; pcVar16 = pcVar16 + 8) {
      scope = *(t_scope **)pcVar16;
      if (*(char *)&scope->v_outer == '\x01') {
        puVar13 = *(pointer *)(outer + 0xf0);
        *(undefined1 **)(outer + 0xf0) =
             (undefined1 *)
             ((long)&(puVar13->_M_t).
                     super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                     ._M_t + 1);
        (scope->v_block).
        super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = puVar13;
      }
      else {
        (scope->v_block).
        super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(*(long *)(outer + 0xe0) - *(long *)(outer + 0xd8) >> 3);
        std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
        push_back((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                   *)(outer + 0xd8),(value_type *)&scope);
      }
    }
    outer = 0;
    *(size_t *)this = sVar19;
    std::_Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
    ~_Vector_base((_Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                   *)&symbol);
    ptVar12 = (t_scope *)outer;
    goto LAB_0017699d;
  case c_token__LEFT_BRACKET:
    pwVar14 = (this_01->v_lexer).v_indent.v_i;
    ptVar8 = (this_01->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_02);
    scope = (t_scope *)
            t_script::f_slot(this_01->v_module,
                             (t_object *)
                             (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1b8) + -0x48));
    std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
              ((t_at *)&outer,(t_object **)&at);
    std::
    make_unique<xemmai::ast::t_call,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>>>
              ((t_at *)&symbol,
               (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                *)&at);
    if (outer != 0) {
      (**(code **)(*(long *)outer + 8))();
    }
    uVar17 = (long)pwVar14 + (-0x50 - (long)ptVar8);
    bVar4 = (this_01->v_lexer).v_newline;
    if ((((bool)bVar4 != true) ||
        (uVar17 < (ulong)((long)(this_01->v_lexer).v_indent.v_i +
                         (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)))) &&
       ((this_01->v_lexer).v_token != c_token__RIGHT_BRACKET)) {
      bVar20 = f_expressions(this_01,(long)uVar17 >> 2,
                             (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                              *)&symbol->v_cyclic);
      *(bool *)&symbol->v_type = bVar20;
      bVar4 = (this_01->v_lexer).v_newline;
    }
    local_90._0_8_ = symbol;
    if ((((bVar4 & 1) == 0) ||
        (uVar17 <= (ulong)((long)(this_01->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)))) &&
       ((this_01->v_lexer).v_token == c_token__RIGHT_BRACKET)) {
      t_lexer::f_next((t_lexer *)this_02);
      local_90._0_8_ = symbol;
    }
    goto LAB_001769e1;
  case c_token__LEFT_BRACE:
    pwVar14 = (this_01->v_lexer).v_indent.v_i;
    ptVar8 = (this_01->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_02);
    scope = (t_scope *)
            t_script::f_slot(this_01->v_module,
                             (t_object *)
                             (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1d8) + -0x48));
    std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
              ((t_at *)&outer,(t_object **)&at);
    std::
    make_unique<xemmai::ast::t_call,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>>>
              ((t_at *)&symbol,
               (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                *)&at);
    if (outer != 0) {
      (**(code **)(*(long *)outer + 8))();
    }
    uVar17 = (long)pwVar14 + (-0x50 - (long)ptVar8);
    bVar20 = (this_01->v_lexer).v_newline;
    if (bVar20 == true) {
      tVar6 = (this_01->v_lexer).v_token;
      cVar5 = '\x01';
      if (tVar6 != c_token__RIGHT_BRACE &&
          uVar17 < (ulong)((long)(this_01->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_01->v_lexer).v_indent.v_p))) {
LAB_00176534:
        while( true ) {
          while( true ) {
            ptVar8 = symbol;
            f_expression((t_parser *)&outer);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
            ::
            emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                      ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                        *)&ptVar8->v_cyclic,
                       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                       )&outer);
            if (outer != 0) {
              (**(code **)(*(long *)outer + 8))();
            }
            if (((this_01->v_lexer).v_token != c_token__COLON) ||
               ((this_01->v_lexer).field_11.v_string != (t_object *)0x1)) {
              a_message_00._M_str = L"expecting \':\'.";
              a_message_00._M_len = 0xe;
              f_throw(this_01,a_message_00);
            }
            t_lexer::f_next((t_lexer *)this_02);
            ptVar8 = symbol;
            f_expression((t_parser *)&outer);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
            ::
            emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                      ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                        *)&ptVar8->v_cyclic,
                       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                       )&outer);
            if (outer != 0) {
              (**(code **)(*(long *)outer + 8))();
            }
            tVar6 = (this_01->v_lexer).v_token;
            cVar5 = (this_01->v_lexer).v_newline;
            if (tVar6 == c_token__COMMA) break;
            if (((bool)cVar5 == false) ||
               ((ulong)((long)(this_01->v_lexer).v_indent.v_i +
                       (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)) <= uVar17))
            goto LAB_001769ad;
          }
          if (((bool)cVar5 != false) &&
             ((ulong)((long)(this_01->v_lexer).v_indent.v_i +
                     (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)) < uVar17)) break;
          t_lexer::f_next((t_lexer *)this_02);
        }
        tVar6 = c_token__COMMA;
      }
LAB_001769ad:
      if (cVar5 == '\0') {
        local_90._0_8_ = symbol;
        if (tVar6 != c_token__RIGHT_BRACE) goto LAB_001769e1;
      }
      else {
LAB_001769b1:
        local_90._0_8_ = symbol;
        if ((ulong)((long)(this_01->v_lexer).v_indent.v_i +
                   (-0x50 - (long)(this_01->v_lexer).v_indent.v_p)) < uVar17 ||
            tVar6 != c_token__RIGHT_BRACE) goto LAB_001769e1;
      }
    }
    else {
      if ((this_01->v_lexer).v_token != c_token__RIGHT_BRACE) goto LAB_00176534;
      if (bVar20 != false) {
        tVar6 = c_token__RIGHT_BRACE;
        goto LAB_001769b1;
      }
    }
    t_lexer::f_next((t_lexer *)this_02);
    local_90._0_8_ = symbol;
    goto LAB_001769e1;
  case c_token__NULL:
    t_lexer::f_next((t_lexer *)this_02);
    __args = (t_at *)&symbol;
    std::make_unique<xemmai::ast::t_null,xemmai::t_at&>(__args);
    break;
  case c_token__TRUE:
    t_lexer::f_next((t_lexer *)this_02);
    outer = CONCAT71(outer._1_7_,1);
    goto LAB_00175e5f;
  case c_token__FALSE:
    t_lexer::f_next((t_lexer *)this_02);
    outer = outer & 0xffffffffffffff00;
LAB_00175e5f:
    __args = (t_at *)&symbol;
    std::make_unique<xemmai::ast::t_literal<bool>,xemmai::t_at&,bool>(__args,(bool *)&at);
    break;
  case c_token__INTEGER:
    symbol = (this_01->v_lexer).field_11.v_string;
    t_lexer::f_next((t_lexer *)this_02);
    std::make_unique<xemmai::ast::t_literal<long>,xemmai::t_at&,long&>
              ((t_at *)&outer,&at.v_position);
    goto LAB_00176176;
  case c_token__FLOAT:
    symbol = (this_01->v_lexer).field_11.v_string;
    t_lexer::f_next((t_lexer *)this_02);
    std::make_unique<xemmai::ast::t_literal<double>,xemmai::t_at&,double&>
              ((t_at *)&outer,(double *)&at);
LAB_00176176:
    this->v_module = (t_script *)outer;
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
  case c_token__STRING:
    ptVar8 = (this_01->v_lexer).field_11.v_string;
    t_lexer::f_next((t_lexer *)this_02);
    outer = (size_t)t_script::f_slot(this_01->v_module,ptVar8);
    __args = (t_at *)&symbol;
    std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
              (__args,(t_object **)&at);
    break;
  case c_token__BREAK:
    auStack_a0._8_8_ = (this_01->v_lexer).v_at.v_column;
    symbol = (t_object *)ptVar1->v_position;
    auStack_a0._0_8_ = (this_01->v_lexer).v_at.v_line;
    if (this_01->v_can_jump == false) {
LAB_00176a1d:
      a_message_01._M_str = L"expecting inside loop.";
      a_message_01._M_len = 0x16;
      f_throw(this_01,a_message_01,(t_at *)&symbol);
    }
    t_lexer::f_next((t_lexer *)this_02);
    if (((this_01->v_lexer).v_newline == false) && (6 < (this_01->v_lexer).v_token - c_token__IF)) {
      f_expression((t_parser *)&scope);
    }
    else {
      scope = (t_scope *)0x0;
    }
    std::
    make_unique<xemmai::ast::t_break,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((t_at *)&outer,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)&symbol
              );
LAB_00176501:
    this->v_module = (t_script *)outer;
    goto LAB_0017650d;
  case c_token__CONTINUE:
    auStack_a0._8_8_ = (this_01->v_lexer).v_at.v_column;
    symbol = (t_object *)ptVar1->v_position;
    auStack_a0._0_8_ = (this_01->v_lexer).v_at.v_line;
    if (this_01->v_can_jump == false) goto LAB_00176a1d;
    t_lexer::f_next((t_lexer *)this_02);
    std::make_unique<xemmai::ast::t_continue,xemmai::t_at&>((t_at *)&outer);
    break;
  case c_token__RETURN:
    if (this_01->v_can_return != false) {
      auStack_a0._8_8_ = (this_01->v_lexer).v_at.v_column;
      symbol = (t_object *)ptVar1->v_position;
      auStack_a0._0_8_ = (this_01->v_lexer).v_at.v_line;
      t_lexer::f_next((t_lexer *)this_02);
      if (((this_01->v_lexer).v_newline == false) && (6 < (this_01->v_lexer).v_token - c_token__IF))
      {
        f_expression((t_parser *)&scope);
      }
      else {
        scope = (t_scope *)0x0;
      }
      std::
      make_unique<xemmai::ast::t_return,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                ((t_at *)&outer,
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 &symbol);
      goto LAB_00176501;
    }
    pwVar14 = L"expecting within lambda.";
LAB_00176aa3:
    ptStack_c0 = (t_lexer *)0x18;
LAB_00176a02:
    a_message._M_str = pwVar14;
    a_message._M_len = (size_t)ptStack_c0;
    f_throw(this_01,a_message);
  case c_token__THROW:
    auStack_a0._8_8_ = (this_01->v_lexer).v_at.v_column;
    symbol = (t_object *)ptVar1->v_position;
    auStack_a0._0_8_ = (this_01->v_lexer).v_at.v_line;
    t_lexer::f_next((t_lexer *)this_02);
    f_expression((t_parser *)&scope);
    std::
    make_unique<xemmai::ast::t_throw,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((t_at *)&outer,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)&symbol
              );
    this->v_module = (t_script *)outer;
LAB_0017650d:
    outer = 0;
    ptVar12 = scope;
LAB_0017699d:
    if (ptVar12 == (t_scope *)0x0) {
      return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
    }
    (*(code *)(ptVar12->v_outer->v_block).
              super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)();
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
  }
  local_90._0_8_ = __args->v_position;
LAB_001769e1:
  this->v_module = local_90._0_8_;
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_target(bool a_assignable)
{
	t_at at = v_lexer.f_at();
	switch (v_lexer.f_token()) {
	case t_lexer::c_token__COLON:
	case t_lexer::c_token__SYMBOL:
	case t_lexer::c_token__SELF:
		{
			size_t outer = 0;
			auto scope = v_scope;
			if (v_lexer.f_token() == t_lexer::c_token__COLON) {
				outer = v_lexer.f_integer();
				for (size_t i = 0; i < outer; ++i) {
					if (!scope) f_throw(L"no more outer scope."sv);
					scope = scope->v_outer;
				}
				v_lexer.f_next();
			}
			switch (v_lexer.f_token()) {
			case t_lexer::c_token__SYMBOL:
				{
					auto symbol = f_symbol();
					v_lexer.f_next();
					if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
						if (!a_assignable) f_throw(L"can not assign to expression."sv);
						if (!scope) f_throw(L"no more outer scope."sv);
						v_lexer.f_next();
						auto& variable = f_variable(scope, symbol);
						if (outer > 0) variable.v_shared = variable.v_varies = true;
						return std::make_unique<ast::t_scope_put>(at, outer, variable, f_expression());
					}
					if (scope) (outer > 0 ? scope->v_unresolveds : scope->v_references).insert(symbol);
					return std::make_unique<ast::t_symbol_get>(at, outer, scope, symbol);
				}
			case t_lexer::c_token__SELF:
				{
					if (!scope) f_throw(L"no more outer scope."sv);
					if (outer > 0) scope->v_self_shared = true;
					std::unique_ptr<ast::t_node> target(new ast::t_self(at, outer));
					for (auto c : v_lexer.f_value()) target.reset(c == L'@' ? new ast::t_class(at, std::move(target)) : static_cast<ast::t_node*>(new ast::t_super(at, std::move(target))));
					v_lexer.f_next();
					if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__SYMBOL) {
						t_at at = v_lexer.f_at();
						auto key = f_symbol();
						v_lexer.f_next();
						if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
							if (!a_assignable) f_throw(L"can not assign to expression."sv);
							v_lexer.f_next();
							return std::make_unique<ast::t_object_put>(at, std::move(target), key, f_expression());
						}
						return std::make_unique<ast::t_object_get>(at, std::move(target), key);
					}
					return target;
				}
			default:
				f_throw(L"expecting symbol or self."sv);
			}
		}
	case t_lexer::c_token__APOSTROPHE:
		v_lexer.f_next();
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__SYMBOL:
			{
				auto symbol = f_symbol();
				v_lexer.f_next();
				return std::make_unique<ast::t_literal<t_object*>>(at, symbol);
			}
		case t_lexer::c_token__LEFT_PARENTHESIS:
			{
				size_t indent = v_lexer.f_indent();
				v_lexer.f_next();
				auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_tuple>()))));
				if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) call->v_expand = f_expressions(indent, call->v_arguments);
				if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_PARENTHESIS) v_lexer.f_next();
				return call;
			}
		default:
			f_throw(L"expecting symbol or '('."sv);
		}
	case t_lexer::c_token__LEFT_PARENTHESIS:
		{
			v_lexer.f_next();
			auto expression = f_expression();
			if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
			v_lexer.f_next();
			return expression;
		}
	case t_lexer::c_token__ATMARK:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto lambda = std::make_unique<ast::t_lambda>(at, v_scope);
			if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__LEFT_PARENTHESIS) {
				v_lexer.f_next();
				if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) {
					while (true) {
						switch (v_lexer.f_token()) {
						case t_lexer::c_token__SYMBOL:
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							v_lexer.f_next();
							if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
								v_lexer.f_next();
								lambda->v_defaults.push_back(f_expression());
							} else {
								if (lambda->v_defaults.size() > 0) f_throw(L"expecting '='."sv);
							}
							if (v_lexer.f_newline() && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) continue;
							if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
								v_lexer.f_next();
								continue;
							}
							break;
						case t_lexer::c_token__ASTERISK:
							v_lexer.f_next();
							if (v_lexer.f_token() != t_lexer::c_token__SYMBOL) f_throw(L"expecting symbol."sv);
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							lambda->v_variadic = true;
							v_lexer.f_next();
							break;
						default:
							f_throw(L"expecting symbol or '*'."sv);
						}
						break;
					}
					if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
				}
				v_lexer.f_next();
			}
			lambda->v_arguments = lambda->v_variables.size();
			v_scope->v_shared = true;
			v_scope = lambda.get();
			bool can_jump = v_can_jump;
			bool can_return = v_can_return;
			v_can_return = true;
			if (v_lexer.f_newline()) {
				if (v_lexer.f_indent() > indent) f_block(lambda->v_block);
			} else {
				lambda->v_block.push_back(f_expression());
				if (v_lexer.f_newline() && v_lexer.f_indent() > indent) f_throw(L"unexpected indent."sv);
			}
			for (auto symbol : lambda->v_unresolveds) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end())
					lambda->v_outer->v_unresolveds.insert(symbol);
				else
					i->second.v_shared = true;
			}
			for (auto symbol : lambda->v_references) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end()) lambda->v_outer->v_unresolveds.insert(symbol);
			}
			v_scope = lambda->v_outer;
			v_can_jump = can_jump;
			v_can_return = can_return;
			std::vector<t_code::t_variable*> variables;
			variables.swap(lambda->v_privates);
			if (lambda->v_self_shared) ++lambda->v_shareds;
			auto i = variables.begin();
			for (auto j = i + lambda->v_arguments; i != j; ++i) {
				t_code::t_variable* p = *i;
				p->v_index = p->v_shared ? lambda->v_shareds++ : lambda->v_privates.size();
				lambda->v_privates.push_back(p);
			}
			for (; i != variables.end(); ++i) {
				t_code::t_variable* p = *i;
				if (p->v_shared) {
					p->v_index = lambda->v_shareds++;
				} else {
					p->v_index = lambda->v_privates.size();
					lambda->v_privates.push_back(p);
				}
			}
			return lambda;
		}
	case t_lexer::c_token__LEFT_BRACKET:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_list>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACKET) call->v_expand = f_expressions(indent, call->v_arguments);
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACKET) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__LEFT_BRACE:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_map>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACE)
				while (true) {
					call->v_arguments.push_back(f_expression());
					if (!f_single_colon()) f_throw(L"expecting ':'."sv);
					v_lexer.f_next();
					call->v_arguments.push_back(f_expression());
					if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
						if (v_lexer.f_newline() && v_lexer.f_indent() < indent) break;
						v_lexer.f_next();
						continue;
					}
					if (!v_lexer.f_newline() || v_lexer.f_indent() <= indent) break;
				}
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACE) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__NULL:
		v_lexer.f_next();
		return std::make_unique<ast::t_null>(at);
	case t_lexer::c_token__TRUE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, true);
	case t_lexer::c_token__FALSE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, false);
	case t_lexer::c_token__INTEGER:
		{
			auto value = v_lexer.f_integer();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<intptr_t>>(at, value);
		}
	case t_lexer::c_token__FLOAT:
		{
			auto value = v_lexer.f_float();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<double>>(at, value);
		}
	case t_lexer::c_token__STRING:
		{
			auto value = v_lexer.f_string();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(value));
		}
	case t_lexer::c_token__BREAK:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_break>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__CONTINUE:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_continue>(at);
		}
	case t_lexer::c_token__RETURN:
		{
			if (!v_can_return) f_throw(L"expecting within lambda."sv);
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_return>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__THROW:
		{
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_throw>(at, f_expression());
		}
	default:
		f_throw(L"unexpected token."sv);
	}
}